

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
njoy::ENDFtk::record::Sequence::
read<njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Sequence *this,
          long nEntries,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  void *pvVar1;
  int in_stack_ffffffffffffffd8;
  undefined4 uStack_24;
  pointer local_18;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Zipper::
  unzip<njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((tuple<std::vector<double,_std::allocator<double>_>_> *)&stack0xffffffffffffffd8,
             (Zipper *)this,nEntries,it,end,lineNumber,MAT,MF,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (__return_storage_ptr__,&stack0xffffffffffffffd8);
  pvVar1 = (void *)CONCAT44(uStack_24,in_stack_ffffffffffffffd8);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_18 - (long)pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< typename ENDFType::Type >
read( long nEntries,
      Iterator& it, const Iterator& end, long& lineNumber,
      int MAT, int MF, int MT ){
  std::vector< typename ENDFType::Type > result;
  std::tie( result ) =
    Zipper::unzip< ENDFType >( nEntries, it, end, lineNumber, MAT, MF, MT );
  return result;
}